

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

void mpc_ast_delete(mpc_ast_t *a)

{
  long lVar1;
  
  if (a != (mpc_ast_t *)0x0) {
    for (lVar1 = 0; lVar1 < a->children_num; lVar1 = lVar1 + 1) {
      mpc_ast_delete(a->children[lVar1]);
    }
    free(a->children);
    free(a->tag);
    free(a->contents);
    free(a);
    return;
  }
  return;
}

Assistant:

void mpc_ast_delete(mpc_ast_t *a) {

  int i;

  if (a == NULL) { return; }

  for (i = 0; i < a->children_num; i++) {
    mpc_ast_delete(a->children[i]);
  }

  free(a->children);
  free(a->tag);
  free(a->contents);
  free(a);

}